

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

uint __thiscall ON_MorphControl::SizeOf(ON_MorphControl *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint sz;
  ON_MorphControl *this_local;
  
  uVar1 = ON_NurbsCurve::SizeOf(&this->m_nurbs_curve0);
  uVar2 = ON_NurbsCurve::SizeOf(&this->m_nurbs_curve);
  uVar3 = ON_NurbsSurface::SizeOf(&this->m_nurbs_surface0);
  uVar4 = ON_NurbsSurface::SizeOf(&this->m_nurbs_surface);
  uVar5 = ON_NurbsCage::SizeOf(&this->m_nurbs_cage);
  uVar6 = ON_ClassArray<ON_Localizer>::SizeOfArray(&this->m_localizers);
  return uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1 + 0x110;
}

Assistant:

unsigned int ON_MorphControl::SizeOf() const
{
  unsigned int sz = sizeof(*this) 
                  - 2*sizeof(ON_NurbsCurve) 
                  - 2*sizeof(ON_NurbsSurface) 
                  - sizeof(m_nurbs_cage);
  sz += m_nurbs_curve0.SizeOf();
  sz += m_nurbs_curve.SizeOf();
  sz += m_nurbs_surface0.SizeOf();
  sz += m_nurbs_surface.SizeOf();
  sz += m_nurbs_cage.SizeOf();
  sz += m_localizers.SizeOfArray();

  return sz;
}